

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importParser.h
# Opt level: O1

void __thiscall sqimportparser::ImportParser::skipSpaceAndComments(ImportParser *this)

{
  byte bVar1;
  byte *pbVar2;
  vector<std::pair<char_const*,char_const*>,std::allocator<std::pair<char_const*,char_const*>>>
  *pvVar3;
  iterator iVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  pair<const_char_*,_const_char_*> local_48;
  byte *local_38;
  
  local_38 = (byte *)0x0;
  bVar5 = false;
  do {
    while( true ) {
      pbVar2 = (byte *)this->p;
      bVar1 = *pbVar2;
      uVar7 = (ulong)bVar1;
      if (0x20 < uVar7) break;
      if (uVar7 == 0) goto LAB_00123f00;
      if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) break;
LAB_00123f7e:
      if (bVar5) {
        if ((bVar1 == 0x2a) && (pbVar2[1] == 0x2f)) {
          this->p = (char *)(pbVar2 + 1);
          pvVar3 = (vector<std::pair<char_const*,char_const*>,std::allocator<std::pair<char_const*,char_const*>>>
                    *)this->keepRanges;
          if (pvVar3 != (vector<std::pair<char_const*,char_const*>,std::allocator<std::pair<char_const*,char_const*>>>
                         *)0x0) {
            local_48.second = (char *)(pbVar2 + 2);
            local_48.first = (char *)local_38;
            iVar4._M_current = *(pair<const_char_*,_const_char_*> **)(pvVar3 + 8);
            if (iVar4._M_current == *(pair<const_char_*,_const_char_*> **)(pvVar3 + 0x10)) {
              std::
              vector<std::pair<char_const*,char_const*>,std::allocator<std::pair<char_const*,char_const*>>>
              ::_M_realloc_insert<std::pair<char_const*,char_const*>>(pvVar3,iVar4,&local_48);
            }
            else {
              (iVar4._M_current)->first = (char *)local_38;
              (iVar4._M_current)->second = local_48.second;
              *(long *)(pvVar3 + 8) = *(long *)(pvVar3 + 8) + 0x10;
            }
          }
          bVar5 = false;
        }
      }
      else if ((bVar1 == 0x2f) && (pbVar2[1] == 0x2a)) {
        this->p = (char *)(pbVar2 + 1);
        bVar5 = true;
        local_38 = pbVar2;
      }
      nextChar(this);
    }
    if ((bVar5) || ((bVar1 == 0x2f && (pbVar2[1] == 0x2a)))) goto LAB_00123f7e;
LAB_00123f00:
    if (bVar5) {
      if (bVar1 == 0) {
        if ((this->errorCb != (ImportErrorCb)0x0) && (this->errors == false)) {
          (*this->errorCb)(this->cbUserPointer,"unexpected end of file inside comment",this->line,
                           ((int)pbVar2 - *(int *)&this->curLinePtr) + 1);
        }
        this->errors = true;
      }
      return;
    }
    pbVar2 = (byte *)this->p;
    if (*pbVar2 != 0x2f) {
      return;
    }
    if (pbVar2[1] != 0x2f) {
      return;
    }
    do {
      if (((byte)*this->p < 0xe) && ((0x2401U >> ((byte)*this->p & 0x1f) & 1) != 0)) break;
      bVar6 = nextChar(this);
    } while (!bVar6);
    pvVar3 = (vector<std::pair<char_const*,char_const*>,std::allocator<std::pair<char_const*,char_const*>>>
              *)this->keepRanges;
    if (pvVar3 != (vector<std::pair<char_const*,char_const*>,std::allocator<std::pair<char_const*,char_const*>>>
                   *)0x0) {
      local_48.second = this->p + 1;
      iVar4._M_current = *(pair<const_char_*,_const_char_*> **)(pvVar3 + 8);
      local_48.first = (char *)pbVar2;
      if (iVar4._M_current == *(pair<const_char_*,_const_char_*> **)(pvVar3 + 0x10)) {
        std::
        vector<std::pair<char_const*,char_const*>,std::allocator<std::pair<char_const*,char_const*>>>
        ::_M_realloc_insert<std::pair<char_const*,char_const*>>(pvVar3,iVar4,&local_48);
      }
      else {
        (iVar4._M_current)->first = (char *)pbVar2;
        (iVar4._M_current)->second = local_48.second;
        *(long *)(pvVar3 + 8) = *(long *)(pvVar3 + 8) + 0x10;
      }
    }
  } while( true );
}

Assistant:

void skipSpaceAndComments()
  {
    bool repeat = true;
    bool insideComment = false;
    const char * commentFrom = nullptr;
    while (repeat)
    {
      repeat = false;
      while (*p && (*p == ' ' || *p == '\t' || *p == '\r' || *p == '\n' || insideComment || (*p == '/' && p[1] == '*')))
      {
        if (!insideComment && *p == '/' && p[1] == '*')
        {
          insideComment = true;
          commentFrom = p;
          p++;
        }
        else if (insideComment && *p == '*' && p[1] == '/')
        {
          insideComment = false;
          p++;

          if (keepRanges)
            keepRanges->push_back(MODULE_PARSE_STL::make_pair(commentFrom, p + 1));
        }
        nextChar();
      }

      if (insideComment && *p == 0)
        error("unexpected end of file inside comment");

      if (!insideComment && *p == '/' && p[1] == '/')
      {
        const char * from = p;
        repeat = true;
        while (*p && *p != '\r' && *p != '\n')
          if (nextChar())
            break;

        if (keepRanges)
          keepRanges->push_back(MODULE_PARSE_STL::make_pair(from, p + 1));
      }
    }
  }